

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O2

void __thiscall testing::internal::RE::~RE(RE *this)

{
  if (this[0x20] == (RE)0x1) {
    regfree((regex_t *)(this + 0x68));
    regfree((regex_t *)(this + 0x28));
  }
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

RE::~RE() {
  if (is_valid_) {
    // regfree'ing an invalid regex might crash because the content
    // of the regex is undefined. Since the regex's are essentially
    // the same, one cannot be valid (or invalid) without the other
    // being so too.
    regfree(&partial_regex_);
    regfree(&full_regex_);
  }
}